

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::WasmByteCodeWriter::AsmBr(WasmByteCodeWriter *this,ByteCodeLabel labelID,OpCodeAsmJs op)

{
  undefined4 local_24;
  undefined8 uStack_20;
  OpLayoutAsmBr data;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  OpCodeAsmJs op_local;
  ByteCodeLabel labelID_local;
  WasmByteCodeWriter *this_local;
  
  ByteCodeWriter::CheckOpen(&this->super_ByteCodeWriter);
  ByteCodeWriter::CheckLabel(&this->super_ByteCodeWriter,labelID);
  uStack_20 = 4;
  local_24 = 4;
  ByteCodeWriter::Data::Encode
            (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_24,4,&this->super_ByteCodeWriter
             ,false);
  AddJumpOffset(this,op,labelID,4);
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmBr(ByteCodeLabel labelID, OpCodeAsmJs op)
    {
        CheckOpen();
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutAsmBr) - offsetof(OpLayoutAsmBr, RelativeJumpOffset);
        OpLayoutAsmBr data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }